

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlnode.cpp
# Opt level: O0

XmlNodePtr __thiscall libcellml::XmlNode::next(XmlNode *this)

{
  element_type *this_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  undefined8 *in_RSI;
  XmlNodePtr XVar2;
  shared_ptr<libcellml::XmlNode> local_38;
  undefined1 local_21;
  xmlNodePtr local_20;
  xmlNodePtr next;
  XmlNode *this_local;
  XmlNodePtr *nextHandle;
  
  local_20 = *(xmlNodePtr *)(*(long *)*in_RSI + 0x30);
  local_21 = 0;
  this_local = this;
  std::shared_ptr<libcellml::XmlNode>::shared_ptr
            ((shared_ptr<libcellml::XmlNode> *)this,(nullptr_t)0x0);
  _Var1._M_pi = extraout_RDX;
  if (local_20 != (xmlNodePtr)0x0) {
    std::make_shared<libcellml::XmlNode>();
    std::shared_ptr<libcellml::XmlNode>::operator=((shared_ptr<libcellml::XmlNode> *)this,&local_38)
    ;
    std::shared_ptr<libcellml::XmlNode>::~shared_ptr(&local_38);
    this_00 = std::__shared_ptr_access<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator->((__shared_ptr_access<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)this);
    setXmlNode(this_00,&local_20);
    _Var1._M_pi = extraout_RDX_00;
  }
  XVar2.super___shared_ptr<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var1._M_pi;
  XVar2.super___shared_ptr<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr = this;
  return (XmlNodePtr)XVar2.super___shared_ptr<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

XmlNodePtr XmlNode::next() const
{
    xmlNodePtr next = mPimpl->mXmlNodePtr->next;
    XmlNodePtr nextHandle = nullptr;
    if (next != nullptr) {
        nextHandle = std::make_shared<XmlNode>();
        nextHandle->setXmlNode(next);
    }
    return nextHandle;
}